

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

void google::protobuf::internal::TcParser::ReportFastUtf8Error
               (uint32_t decoded_tag,TcParseTableBase *table)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  FieldEntry *field_entry;
  string_view sVar4;
  string_view message_name;
  string_view field_name;
  bool in_stack_00000008;
  
  field_entry = FindFieldEntry(table,decoded_tag >> 3);
  pcVar1 = (char *)((long)&table->has_bits_offset +
                   (ulong)table->num_aux_entries * 8 + (ulong)table->aux_offset);
  uVar3 = table->num_field_entries;
  cVar2 = *pcVar1;
  sVar4 = FieldName(table,field_entry);
  message_name._M_str = (char *)sVar4._M_len;
  message_name._M_len = (size_t)(pcVar1 + (uVar3 + 8 & 0xfffffff8));
  field_name._M_str = "parsing";
  field_name._M_len = (size_t)sVar4._M_str;
  PrintUTF8ErrorLog((internal *)(long)cVar2,message_name,field_name,(char *)0x0,in_stack_00000008);
  return;
}

Assistant:

void TcParser::ReportFastUtf8Error(uint32_t decoded_tag,
                                   const TcParseTableBase* table) {
  uint32_t field_num = decoded_tag >> 3;
  const auto* entry = FindFieldEntry(table, field_num);
  PrintUTF8ErrorLog(MessageName(table), FieldName(table, entry), "parsing",
                    false);
}